

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

int units::precise::custom::custom_unit_number(unit_data *UT)

{
  unit_data uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  uVar1 = *UT;
  uVar5 = ((int)uVar1 << 0x1c) >> 0x1c;
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  uVar6 = (int)uVar1._0_1_ >> 4;
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar7 = ((int)uVar1 << 0x15) >> 0x1d;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  iVar8 = ((int)uVar1 << 0xd) >> 0x1d;
  iVar3 = -iVar8;
  if (0 < iVar8) {
    iVar3 = iVar8;
  }
  uVar9 = (int)uVar1._0_2_ >> 0xe;
  uVar7 = -uVar9;
  if (0 < (int)uVar9) {
    uVar7 = uVar9;
  }
  uVar4 = ((int)uVar1 << 6) >> 0x1e;
  uVar9 = -uVar4;
  if (0 < (int)uVar4) {
    uVar9 = uVar4;
  }
  return (uint)(uVar7 < 2) * 0x20 + (uint)(iVar3 == 3) * 0x10 +
         ((uint)(((uint)uVar1 & 0x3800) == 0x2000) << 6 |
          (uint)uVar1 >> 0x1a & 4 | (uint)uVar1 >> 0x1c & 2 | (uint)uVar1 >> 0x1e & 1 |
          (uint)(uVar2 < 4) << 8 | (uint)(5 < uVar5) << 9 | (uint)(uVar6 < 2) << 7) +
         (uint)(1 < uVar9) * 8;
}

Assistant:

constexpr bool has_e_flag() const { return e_flag_ != 0U; }